

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_perftest.cc
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int64_t iVar5;
  int64_t iVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  int *piVar8;
  char *pcVar9;
  bool measure_command_evaluation;
  float fVar10;
  int delta;
  vector<int,_std::allocator<int>_> times;
  string err;
  char kManifestDir [24];
  
  bVar2 = true;
  do {
    measure_command_evaluation = bVar2;
    iVar3 = getopt(argc,argv,"fh");
    bVar2 = false;
  } while (iVar3 == 0x66);
  if (iVar3 == -1) {
    builtin_strncpy(kManifestDir,"build/manifest_perftest",0x18);
    err._M_dataplus._M_p = (pointer)&err.field_2;
    err._M_string_length = 0;
    err.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&times,kManifestDir,(allocator<char> *)&delta);
    bVar2 = WriteFakeManifests((string *)&times,&err);
    std::__cxx11::string::~string((string *)&times);
    if (bVar2) {
      iVar3 = chdir(kManifestDir);
      if (iVar3 < 0) {
        piVar8 = __errno_location();
        pcVar9 = strerror(*piVar8);
        Fatal("chdir: %s",pcVar9);
      }
      times.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      times.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      times.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      iVar3 = 5;
      while (bVar2 = iVar3 != 0, iVar3 = iVar3 + -1, bVar2) {
        iVar5 = GetTimeMillis();
        uVar4 = LoadManifests(measure_command_evaluation);
        iVar6 = GetTimeMillis();
        delta = (int)iVar6 - (int)iVar5;
        printf("%dms (hash: %x)\n",(ulong)(uint)delta,(ulong)uVar4);
        std::vector<int,_std::allocator<int>_>::push_back(&times,&delta);
      }
      _Var7 = std::
              __min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (times.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         times.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      uVar4 = *_Var7._M_current;
      _Var7 = std::
              __max_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (times.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         times.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      uVar1 = *_Var7._M_current;
      fVar10 = std::
               accumulate<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,float>
                         ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                          times.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                          times.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish,0.0);
      printf("min %dms  max %dms  avg %.1fms\n",
             SUB84((double)(fVar10 / (float)(ulong)((long)times.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  (long)times.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start >> 2)),0)
             ,(ulong)uVar4,(ulong)uVar1);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&times.super__Vector_base<int,_std::allocator<int>_>);
      iVar3 = 0;
    }
    else {
      fprintf(_stderr,"Failed to write test data: %s\n",err._M_dataplus._M_p);
      iVar3 = 1;
    }
    std::__cxx11::string::~string((string *)&err);
  }
  else {
    puts(
        "usage: manifest_parser_perftest\n\noptions:\n  -f     only measure manifest load time, not command evaluation time"
        );
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int main(int argc, char* argv[]) {
  bool measure_command_evaluation = true;
  int opt;
  while ((opt = getopt(argc, argv, const_cast<char*>("fh"))) != -1) {
    switch (opt) {
    case 'f':
      measure_command_evaluation = false;
      break;
    case 'h':
    default:
      printf("usage: manifest_parser_perftest\n"
"\n"
"options:\n"
"  -f     only measure manifest load time, not command evaluation time\n"
             );
    return 1;
    }
  }

  const char kManifestDir[] = "build/manifest_perftest";

  string err;
  if (!WriteFakeManifests(kManifestDir, &err)) {
    fprintf(stderr, "Failed to write test data: %s\n", err.c_str());
    return 1;
  }

  if (chdir(kManifestDir) < 0)
    Fatal("chdir: %s", strerror(errno));

  const int kNumRepetitions = 5;
  vector<int> times;
  for (int i = 0; i < kNumRepetitions; ++i) {
    int64_t start = GetTimeMillis();
    int optimization_guard = LoadManifests(measure_command_evaluation);
    int delta = (int)(GetTimeMillis() - start);
    printf("%dms (hash: %x)\n", delta, optimization_guard);
    times.push_back(delta);
  }

  int min = *min_element(times.begin(), times.end());
  int max = *max_element(times.begin(), times.end());
  float total = accumulate(times.begin(), times.end(), 0.0f);
  printf("min %dms  max %dms  avg %.1fms\n", min, max, total / times.size());
}